

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters_test.cc
# Opt level: O0

void __thiscall xLearn::MODEL_TEST_Init_lr_Test::TestBody(MODEL_TEST_Init_lr_Test *this)

{
  uint uVar1;
  bool bVar2;
  index_t iVar3;
  char *pcVar4;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  index_t j;
  AssertionResult gtest_ar_5;
  index_t i;
  index_t aux_size;
  string *in_stack_00000120;
  string *in_stack_00000128;
  AssertionResult gtest_ar_4;
  index_t in_stack_00000140;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  index_t param_num_v;
  real_t *v;
  index_t param_num_w;
  real_t *w;
  real_t *b;
  Model model_lr;
  HyperParam hyper_param;
  HyperParam *in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffb58;
  undefined1 in_stack_fffffffffffffb5f;
  char *in_stack_fffffffffffffb60;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  AssertHelper local_410;
  Message local_408;
  undefined8 local_400;
  AssertionResult local_3f8;
  AssertHelper local_3e8;
  Message local_3e0;
  AssertionResult local_3d8;
  uint local_3c4;
  AssertHelper local_3c0;
  Message local_3b8;
  AssertionResult local_3b0;
  uint local_3a0;
  uint local_39c;
  AssertHelper local_398;
  Message local_390;
  AssertionResult local_388;
  AssertHelper local_378;
  Message local_370;
  AssertionResult local_368;
  AssertHelper local_358;
  Message local_350;
  index_t local_348;
  int local_344;
  AssertionResult local_340;
  AssertHelper local_330;
  Message local_328;
  index_t local_31c;
  AssertionResult local_318;
  AssertHelper local_308;
  Message local_300;
  index_t local_2f4;
  AssertionResult local_2f0;
  int local_2dc;
  real_t *local_2d8;
  int local_2cc;
  real_t *local_2c8;
  real_t *local_2c0;
  Model local_2b8;
  string local_210 [136];
  uint local_188;
  int local_160;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  
  Init();
  std::__cxx11::string::operator=(local_210,"linear");
  Model::Model((Model *)in_stack_fffffffffffffb50);
  Model::Initialize((Model *)gtest_ar_4._0_8_,in_stack_00000128,in_stack_00000120,aux_size,i,
                    gtest_ar_5.message_.ptr_._4_4_,in_stack_00000140,gtest_ar_5.message_.ptr_._0_4_)
  ;
  local_2c0 = Model::GetParameter_b(&local_2b8);
  local_2c8 = Model::GetParameter_w(&local_2b8);
  local_2cc = local_160 * 2;
  local_2d8 = Model::GetParameter_v(&local_2b8);
  local_2dc = 0;
  local_2f4 = Model::GetNumParameter_w(&local_2b8);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
             in_stack_fffffffffffffb60,
             (uint *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
             (uint *)in_stack_fffffffffffffb50);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
  if (!bVar2) {
    testing::Message::Message(&local_300);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x13e7eb);
    testing::internal::AssertHelper::AssertHelper
              (&local_308,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x86,pcVar4);
    testing::internal::AssertHelper::operator=(&local_308,&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_308);
    testing::Message::~Message((Message *)0x13e84e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13e8a3);
  local_31c = Model::GetNumParameter_v(&local_2b8);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
             in_stack_fffffffffffffb60,
             (uint *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
             (uint *)in_stack_fffffffffffffb50);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_318);
  if (!bVar2) {
    testing::Message::Message(&local_328);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x13e957);
    testing::internal::AssertHelper::AssertHelper
              (&local_330,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x87,pcVar4);
    testing::internal::AssertHelper::operator=(&local_330,&local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_330);
    testing::Message::~Message((Message *)0x13e9b4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ea0c);
  local_344 = local_2dc + 2 + local_2cc;
  local_348 = Model::GetNumParameter(&local_2b8);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((char *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
             in_stack_fffffffffffffb60,
             (uint *)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
             (uint *)in_stack_fffffffffffffb50);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_340);
  if (!bVar2) {
    testing::Message::Message(&local_350);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x13eadd);
    testing::internal::AssertHelper::AssertHelper
              (&local_358,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x88,pcVar4);
    testing::internal::AssertHelper::operator=(&local_358,&local_350);
    testing::internal::AssertHelper::~AssertHelper(&local_358);
    testing::Message::~Message((Message *)0x13eb3a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13eb8f);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
             in_stack_ffffffffffffff08);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_368);
  if (!bVar2) {
    testing::Message::Message(&local_370);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x13ec25);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=(&local_378,&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    testing::Message::~Message((Message *)0x13ec82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ecd7);
  testing::internal::CmpHelperFloatingPointEQ<float>
            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
             in_stack_ffffffffffffff08);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_388);
  if (!bVar2) {
    testing::Message::Message(&local_390);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x13ed72);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x8a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::Message::~Message((Message *)0x13edcf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13ee27);
  local_39c = local_188;
  for (local_3a0 = 0; uVar1 = local_3a0, iVar3 = Model::GetNumParameter_w(&local_2b8), uVar1 < iVar3
      ; local_3a0 = local_39c + local_3a0) {
    testing::internal::CmpHelperFloatingPointEQ<float>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               in_stack_ffffffffffffff08);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
    if (!bVar2) {
      testing::Message::Message(&local_3b8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x13ef0c);
      testing::internal::AssertHelper::AssertHelper
                (&local_3c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                 ,0x8d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
      testing::internal::AssertHelper::~AssertHelper(&local_3c0);
      testing::Message::~Message((Message *)0x13ef69);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x13efc1);
    for (local_3c4 = 1; local_3c4 < local_39c; local_3c4 = local_3c4 + 1) {
      testing::internal::CmpHelperFloatingPointEQ<float>
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 in_stack_ffffffffffffff08);
      in_stack_fffffffffffffb6f = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
      if (!(bool)in_stack_fffffffffffffb6f) {
        testing::Message::Message(&local_3e0);
        in_stack_fffffffffffffb60 =
             testing::AssertionResult::failure_message((AssertionResult *)0x13f08b);
        testing::internal::AssertHelper::AssertHelper
                  (&local_3e8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
                   ,0x8f,in_stack_fffffffffffffb60);
        testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
        testing::internal::AssertHelper::~AssertHelper(&local_3e8);
        testing::Message::~Message((Message *)0x13f0e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f13d);
    }
  }
  local_400 = 0;
  testing::internal::EqHelper<false>::Compare<float*,decltype(nullptr)>
            ((char *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
             in_stack_fffffffffffffb60,
             (float **)CONCAT17(in_stack_fffffffffffffb5f,in_stack_fffffffffffffb58),
             (void **)in_stack_fffffffffffffb50);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
  if (!bVar2) {
    testing::Message::Message(&local_408);
    in_stack_fffffffffffffb50 =
         (HyperParam *)testing::AssertionResult::failure_message((AssertionResult *)0x13f211);
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/model_parameters_test.cc"
               ,0x92,(char *)in_stack_fffffffffffffb50);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    testing::Message::~Message((Message *)0x13f26e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13f2c3);
  Model::~Model((Model *)in_stack_fffffffffffffb50);
  HyperParam::~HyperParam(in_stack_fffffffffffffb50);
  return;
}

Assistant:

TEST(MODEL_TEST, Init_lr) {
  HyperParam hyper_param = Init();
  hyper_param.score_func = "linear";
  Model model_lr;
  model_lr.Initialize(hyper_param.score_func,
                    hyper_param.loss_func,
                    hyper_param.num_feature,
                    hyper_param.num_field,
                    hyper_param.num_K,
                    hyper_param.auxiliary_size, 
                    0.5);
  real_t* b = model_lr.GetParameter_b();
  real_t* w = model_lr.GetParameter_w();
  index_t param_num_w = hyper_param.num_feature * 2;
  real_t* v = model_lr.GetParameter_v();
  index_t param_num_v = 0;
  EXPECT_EQ(param_num_w, model_lr.GetNumParameter_w());
  EXPECT_EQ(param_num_v, model_lr.GetNumParameter_v());
  EXPECT_EQ(param_num_v+param_num_w+2, model_lr.GetNumParameter());
  EXPECT_FLOAT_EQ(b[0], 0);
  EXPECT_FLOAT_EQ(b[1], 1.0);
  index_t aux_size = hyper_param.auxiliary_size;
  for (index_t i = 0; i < model_lr.GetNumParameter_w(); i+=aux_size) {
    EXPECT_FLOAT_EQ(w[i], 0.0);
    for (index_t j = 1; j < aux_size; ++j) {
      EXPECT_FLOAT_EQ(w[i+j], 1.0);
    }
  }
  EXPECT_EQ(v, nullptr);
}